

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.h
# Opt level: O1

void wasm::Names::ensureNames(Function *func)

{
  _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this;
  Index IVar1;
  bool bVar2;
  size_t sVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  uint uVar6;
  uint uVar7;
  _Hash_node_base *p_Var8;
  pair<std::__detail::_Node_iterator<wasm::Name,_true,_true>,_bool> pVar9;
  undefined1 local_90 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seen;
  undefined1 auStack_50 [8];
  Name name;
  Index local_34;
  
  local_90 = (undefined1  [8])&seen._M_h._M_rehash_policy._M_next_resize;
  seen._M_h._M_buckets = (__buckets_ptr)0x1;
  seen._M_h._M_bucket_count = 0;
  seen._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seen._M_h._M_element_count._0_4_ = 0x3f800000;
  seen._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seen._M_h._M_rehash_policy._4_4_ = 0;
  seen._M_h._M_rehash_policy._M_next_resize = 0;
  p_Var8 = (func->localNames)._M_h._M_before_begin._M_nxt;
  name.super_IString.str._M_str = (char *)func;
  if (p_Var8 != (_Hash_node_base *)0x0) {
    do {
      auStack_50 = (undefined1  [8])local_90;
      std::
      _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_90,p_Var8 + 2,auStack_50);
      p_Var8 = p_Var8->_M_nxt;
    } while (p_Var8 != (_Hash_node_base *)0x0);
  }
  seen._M_h._M_single_bucket = (__node_base_ptr)(name.super_IString.str._M_str + 0x68);
  this = (_Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
          *)(name.super_IString.str._M_str + 0xa0);
  uVar6 = 0;
  uVar7 = (uint)seen._M_h._M_before_begin._M_nxt;
LAB_008ead0b:
  local_34 = uVar6;
  sVar3 = Function::getNumLocals((Function *)name.super_IString.str._M_str);
  if (sVar3 <= uVar6) {
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_90);
    return;
  }
  bVar2 = Function::hasLocalName((Function *)name.super_IString.str._M_str,local_34);
  if (!bVar2) {
    do {
      _auStack_50 = (string_view)Name::fromInt((ulong)uVar7);
      pVar9 = std::
              _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              ::_M_emplace<wasm::Name&>
                        ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                          *)local_90,(key_type *)auStack_50);
      if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pmVar4 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)seen._M_h._M_single_bucket,&local_34);
        IVar1 = local_34;
        (pmVar4->super_IString).str._M_len = (size_t)auStack_50;
        (pmVar4->super_IString).str._M_str = (char *)name.super_IString.str._M_len;
        pmVar5 = std::__detail::
                 _Map_base<wasm::Name,_std::pair<const_wasm::Name,_unsigned_int>,_std::allocator<std::pair<const_wasm::Name,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[](this,(key_type *)auStack_50);
        *pmVar5 = IVar1;
        if (((undefined1  [16])pVar9 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto LAB_008ead84;
      }
      uVar7 = uVar7 + 1;
    } while( true );
  }
  goto LAB_008ead87;
LAB_008ead84:
  uVar7 = uVar7 + 1;
LAB_008ead87:
  uVar6 = local_34 + 1;
  goto LAB_008ead0b;
}

Assistant:

inline void ensureNames(Function* func) {
  std::unordered_set<Name> seen;
  for (auto& [_, name] : func->localNames) {
    seen.insert(name);
  }
  Index nameIndex = seen.size();
  for (Index i = 0; i < func->getNumLocals(); i++) {
    if (!func->hasLocalName(i)) {
      while (1) {
        auto name = Name::fromInt(nameIndex++);
        if (seen.emplace(name).second) {
          func->localNames[i] = name;
          func->localIndices[name] = i;
          break;
        }
      }
    }
  }
}